

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::fromFirst(String *this,String *find,bool includeFind)

{
  int iVar1;
  char in_CL;
  undefined7 in_register_00000011;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  int iVar3;
  String SVar4;
  uchar *puVar2;
  
  iVar3 = 0;
  iVar1 = binstr(&find->super_tagbstring,0,(bstring)CONCAT71(in_register_00000011,includeFind));
  if (iVar1 == -1) {
    if (in_CL == '\0') {
      String(this);
      puVar2 = extraout_RDX_00;
    }
    else {
      String(this,find);
      puVar2 = extraout_RDX;
    }
  }
  else {
    if (in_CL == '\0') {
      iVar3 = ((bstring)CONCAT71(in_register_00000011,includeFind))->slen;
    }
    SVar4 = midString(this,(int)find,iVar3 + iVar1);
    puVar2 = SVar4.super_tagbstring.data;
  }
  SVar4.super_tagbstring.data = puVar2;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

const String String::fromFirst(const String & find, const bool includeFind) const
    {
        int pos = Find(find, 0);
        if (pos == -1) return includeFind ? *this : String();
        return midString(includeFind ? pos : pos + find.getLength(), slen);
    }